

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFExporter.cpp
# Opt level: O2

void __thiscall
Assimp::D3MF::D3MFExporter::writeModelToArchive(D3MFExporter *this,string *folder,string *modelName)

{
  DeadlyImportError *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string entry;
  
  if (this->m_zipArchive != (zip_t *)0x0) {
    std::operator+(&local_60,folder,"/");
    std::operator+(&entry,&local_60,modelName);
    std::__cxx11::string::~string((string *)&local_60);
    zip_entry_open(this->m_zipArchive,entry._M_dataplus._M_p);
    std::__cxx11::stringbuf::str();
    zip_entry_write(this->m_zipArchive,local_60._M_dataplus._M_p,local_60._M_string_length);
    zip_entry_close(this->m_zipArchive);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&entry);
    return;
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&entry,"3MF-Export: Zip archive not valid, nullptr.",
             (allocator<char> *)&local_60);
  DeadlyImportError::DeadlyImportError(this_00,&entry);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void D3MFExporter::writeModelToArchive( const std::string &folder, const std::string &modelName ) {
    if ( nullptr == m_zipArchive ) {
        throw DeadlyExportError( "3MF-Export: Zip archive not valid, nullptr." );
    }
    const std::string entry = folder + "/" + modelName;
    zip_entry_open( m_zipArchive, entry.c_str() );

    const std::string &exportTxt( mModelOutput.str() );
    zip_entry_write( m_zipArchive, exportTxt.c_str(), exportTxt.size() );

    zip_entry_close( m_zipArchive );
}